

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_location.hpp
# Opt level: O0

void __thiscall toml::source_location::source_location(source_location *this,region_base *reg)

{
  bool bVar1;
  int iVar2;
  uint_least32_t uVar3;
  unsigned_long uVar4;
  string local_d8 [32];
  string local_b8 [32];
  string local_98;
  region_base local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  region_base *local_18;
  region_base *reg_local;
  source_location *this_local;
  
  this->line_num_ = 1;
  this->column_num_ = 1;
  this->region_size_ = 1;
  local_18 = reg;
  reg_local = (region_base *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->file_name_,"unknown file",&local_19);
  std::allocator<char>::~allocator(&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->line_str_,"",local_2d);
  std::allocator<char>::~allocator(local_2d);
  if (local_18 != (region_base *)0x0) {
    (*local_18->_vptr_region_base[7])(&local_50);
    local_78._vptr_region_base = (_func_int **)0x0;
    detail::region_base::region_base(&local_78);
    detail::region_base::line_num_abi_cxx11_(&local_70,&local_78);
    bVar1 = std::operator!=(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    detail::region_base::~region_base(&local_78);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      (*local_18->_vptr_region_base[7])(&local_98);
      uVar4 = std::__cxx11::stoul(&local_98,(size_t *)0x0,10);
      this->line_num_ = (uint_least32_t)uVar4;
      std::__cxx11::string::~string((string *)&local_98);
    }
    iVar2 = (*local_18->_vptr_region_base[9])();
    this->column_num_ = iVar2 + 1;
    uVar3 = (*local_18->_vptr_region_base[8])();
    this->region_size_ = uVar3;
    (*local_18->_vptr_region_base[5])(local_b8);
    std::__cxx11::string::operator=((string *)&this->file_name_,local_b8);
    std::__cxx11::string::~string(local_b8);
    (*local_18->_vptr_region_base[6])(local_d8);
    std::__cxx11::string::operator=((string *)&this->line_str_,local_d8);
    std::__cxx11::string::~string(local_d8);
  }
  return;
}

Assistant:

explicit source_location(const detail::region_base* reg)
        : line_num_(1), column_num_(1), region_size_(1),
          file_name_("unknown file"), line_str_("")
    {
        if(reg)
        {
            if(reg->line_num() != detail::region_base().line_num())
            {
                line_num_ = static_cast<std::uint_least32_t>(
                        std::stoul(reg->line_num()));
            }
            column_num_  = static_cast<std::uint_least32_t>(reg->before() + 1);
            region_size_ = static_cast<std::uint_least32_t>(reg->size());
            file_name_   = reg->name();
            line_str_    = reg->line();
        }
    }